

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.c
# Opt level: O3

curl_version_info_data * curl_version_info(CURLversion stamp)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  feat *pfVar5;
  
  Curl_ssl_version(curl_version_info::ssl_buffer,0x50);
  version_info.ssl_version = curl_version_info::ssl_buffer;
  version_info.libz_version = (char *)zlibVersion();
  uVar4 = 0;
  pcVar2 = "alt-svc";
  pfVar5 = features_table;
  lVar3 = 0;
  do {
    pfVar5 = pfVar5 + 1;
    if (pfVar5[-1].present == (_func_int_curl_version_info_data_ptr *)0x0) {
LAB_00163cde:
      uVar4 = uVar4 | pfVar5[-1].bitmask;
      feature_names[lVar3] = pcVar2;
      lVar3 = lVar3 + 1;
    }
    else {
      iVar1 = (*pfVar5[-1].present)(&version_info);
      if (iVar1 != 0) goto LAB_00163cde;
    }
    pcVar2 = pfVar5->name;
    if (pcVar2 == (char *)0x0) {
      feature_names[lVar3] = (char *)0x0;
      version_info.features = uVar4;
      return &version_info;
    }
  } while( true );
}

Assistant:

curl_version_info_data *curl_version_info(CURLversion stamp)
{
  size_t n;
  const struct feat *p;
  int features = 0;

#if defined(USE_SSH)
  static char ssh_buf[80];  /* 'ssh_buffer' clashes with libssh/libssh.h */
#endif
#ifdef USE_SSL
#ifdef CURL_WITH_MULTI_SSL
  static char ssl_buffer[200];
#else
  static char ssl_buffer[80];
#endif
#endif
#ifdef HAVE_BROTLI
  static char brotli_buffer[80];
#endif
#ifdef HAVE_ZSTD
  static char zstd_buffer[80];
#endif

  (void)stamp; /* avoid compiler warnings, we do not use this */

#ifdef USE_SSL
  Curl_ssl_version(ssl_buffer, sizeof(ssl_buffer));
  version_info.ssl_version = ssl_buffer;
#endif

#ifdef HAVE_LIBZ
  version_info.libz_version = zlibVersion();
  /* libz left NULL if non-existing */
#endif
#ifdef USE_ARES
  {
    int aresnum;
    version_info.ares = ares_version(&aresnum);
    version_info.ares_num = aresnum;
  }
#endif
#ifdef USE_LIBIDN2
  /* This returns a version string if we use the given version or later,
     otherwise it returns NULL */
  version_info.libidn = idn2_check_version(IDN2_VERSION);
#endif

#if defined(USE_SSH)
  Curl_ssh_version(ssh_buf, sizeof(ssh_buf));
  version_info.libssh_version = ssh_buf;
#endif

#ifdef HAVE_BROTLI
  version_info.brotli_ver_num = BrotliDecoderVersion();
  brotli_version(brotli_buffer, sizeof(brotli_buffer));
  version_info.brotli_version = brotli_buffer;
#endif

#ifdef HAVE_ZSTD
  version_info.zstd_ver_num = (unsigned int)ZSTD_versionNumber();
  zstd_version(zstd_buffer, sizeof(zstd_buffer));
  version_info.zstd_version = zstd_buffer;
#endif

#ifdef USE_NGHTTP2
  {
    nghttp2_info *h2 = nghttp2_version(0);
    version_info.nghttp2_ver_num = (unsigned int)h2->version_num;
    version_info.nghttp2_version = h2->version_str;
  }
#endif

#ifdef USE_HTTP3
  {
    static char quicbuffer[80];
    Curl_quic_ver(quicbuffer, sizeof(quicbuffer));
    version_info.quic_version = quicbuffer;
  }
#endif

#ifdef USE_HYPER
  {
    static char hyper_buffer[30];
    msnprintf(hyper_buffer, sizeof(hyper_buffer), "Hyper/%s", hyper_version());
    version_info.hyper_version = hyper_buffer;
  }
#endif

#ifdef USE_GSASL
  {
    version_info.gsasl_version = gsasl_check_version(NULL);
  }
#endif

  /* Get available features, build bitmask and names array. */
  n = 0;
  for(p = features_table; p->name; p++)
    if(!p->present || p->present(&version_info)) {
      features |= p->bitmask;
      feature_names[n++] = p->name;
    }

  feature_names[n] = NULL;  /* Terminate array. */
  version_info.features = features;

#ifdef USE_LIBRTMP
  {
    static char rtmp_version[30];
    Curl_rtmp_version(rtmp_version, sizeof(rtmp_version));
    version_info.rtmp_version = rtmp_version;
  }
#endif

  return &version_info;
}